

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>
::_container_insert(Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>
                    *this,Column *column,Index pos)

{
  Index local_20;
  Index local_1c;
  Column *pCStack_18;
  Index pos_local;
  Column *column_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>
  *this_local;
  
  local_1c = pos;
  pCStack_18 = column;
  column_local = (Column *)this;
  local_20 = Row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>
             ::get_column_index(&column->super_Row_access_option);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>>>
  ::
  emplace_back<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>const&,unsigned_int,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>*&,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>::Column_zp_settings*&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>>>
              *)&this->matrix_,column,&local_20,
             (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
              **)this,&this->colSettings_);
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::_container_insert(const Column& column, [[maybe_unused]] Index pos)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(column, column.get_column_index(), RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(column, column.get_column_index(), RA_opt::rows_, colSettings_);
    } else {
      matrix_.emplace_back(column, colSettings_);
    }
  }
}